

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

int Gia_ManOrderWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNodes_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                      ,0x10c,"int Gia_ManOrderWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
        ;
      }
      iVar1 = Gia_ObjIsBuf(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjId(p,pObj);
        iVar1 = Gia_ObjSibl(p,iVar1);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjId(p,pObj);
          pGVar2 = Gia_ObjSiblObj(p,iVar1);
          iVar1 = Gia_ManOrderWithBoxes_rec(p,pGVar2,vNodes);
          if (iVar1 != 0) {
            return 1;
          }
        }
        pGVar2 = Gia_ObjFanin0(pObj);
        iVar1 = Gia_ManOrderWithBoxes_rec(p,pGVar2,vNodes);
        if (iVar1 == 0) {
          pGVar2 = Gia_ObjFanin1(pObj);
          iVar1 = Gia_ManOrderWithBoxes_rec(p,pGVar2,vNodes);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjId(p,pObj);
            Vec_IntPush(vNodes,iVar1);
            p_local._4_4_ = 0;
          }
          else {
            p_local._4_4_ = 1;
          }
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        pGVar2 = Gia_ObjFanin0(pObj);
        iVar1 = Gia_ManOrderWithBoxes_rec(p,pGVar2,vNodes);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjId(p,pObj);
          Vec_IntPush(vNodes,iVar1);
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = 1;
        }
      }
    }
    else {
      iVar1 = Gia_ObjCioId(pObj);
      p->iData2 = iVar1;
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManOrderWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        p->iData2 = Gia_ObjCioId(pObj);
        return 1;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsBuf(pObj) )
    {
        if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
            return 1;
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return 0;
    }
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)), vNodes ) )
            return 1;
    if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
        return 1;
    if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin1(pObj), vNodes ) )
        return 1;
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    return 0;
}